

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O3

string * __thiscall
fasttext::Dictionary::getLabel_abi_cxx11_
          (string *__return_storage_ptr__,Dictionary *this,int32_t lid)

{
  pointer peVar1;
  _Alloc_hider _Var2;
  invalid_argument *this_00;
  long *plVar3;
  long lVar4;
  long *plVar5;
  long *local_80;
  long local_78;
  long local_70;
  long lStack_68;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if ((-1 < lid) && (lid < this->nlabels_)) {
    lVar4 = (long)lid + (long)this->nwords_;
    peVar1 = (this->words_).super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>.
             _M_impl.super__Vector_impl_data._M_start;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    _Var2._M_p = peVar1[lVar4].word._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,_Var2._M_p,
               _Var2._M_p + peVar1[lVar4].word._M_string_length);
    return __return_storage_ptr__;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::__cxx11::to_string(&local_60,this->nlabels_);
  std::operator+(&local_40,"Label id is out of range [0, ",&local_60);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_40);
  local_80 = (long *)*plVar3;
  plVar5 = plVar3 + 2;
  if (local_80 == plVar5) {
    local_70 = *plVar5;
    lStack_68 = plVar3[3];
    local_80 = &local_70;
  }
  else {
    local_70 = *plVar5;
  }
  local_78 = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::invalid_argument::invalid_argument(this_00,(string *)&local_80);
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

std::string Dictionary::getLabel(int32_t lid) const {
  if (lid < 0 || lid >= nlabels_) {
    throw std::invalid_argument(
        "Label id is out of range [0, " + std::to_string(nlabels_) + "]");
  }
  return words_[lid + nwords_].word;
}